

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * tinyusdz::print_typed_token_attr<tinyusdz::CollectionInstance::ExpansionRule>
                   (string *__return_storage_ptr__,
                   TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule> *attr,
                   string *name,uint32_t indent)

{
  Path *v;
  bool bVar1;
  long *plVar2;
  ostream *poVar3;
  long lVar4;
  uint32_t indent_00;
  undefined4 in_register_0000000c;
  pprint *this;
  pprint *ppVar5;
  size_type *psVar6;
  uint32_t n;
  ExpansionRule rule;
  uint32_t n_00;
  uint32_t n_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  stringstream ss;
  string local_238;
  string local_218;
  long *local_1f8;
  long local_1f0;
  long local_1e8 [2];
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  this = (pprint *)CONCAT44(in_register_0000000c,indent);
  ppVar5 = this;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  indent_00 = (uint32_t)ppVar5;
  if ((((attr->_empty != false) || ((attr->_attrib).has_value_ != false)) ||
      ((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_finish !=
       (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_start)) || (attr->_blocked == true)) {
    pprint::Indent_abi_cxx11_(&local_238,this,n);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_238._M_dataplus._M_p,local_238._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"uniform token ",0xe);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,(name->_M_dataplus)._M_p,name->_M_string_length);
    if (attr->_blocked == true) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = None",7);
    }
    else {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = ",3);
      to_string_abi_cxx11_
                (&local_1d8,
                 (tinyusdz *)(ulong)(uint)(&attr->_attrib)[(attr->_attrib).has_value_ ^ 1].contained
                 ,rule);
      local_1f8 = local_1e8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"\"","");
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,local_1f8,local_1f0 + (long)local_1f8);
      ::std::__cxx11::string::_M_append((char *)&local_238,(ulong)local_1d8._M_dataplus._M_p);
      plVar2 = (long *)::std::__cxx11::string::_M_append((char *)&local_238,(ulong)local_1f8);
      psVar6 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_218.field_2._M_allocated_capacity = *psVar6;
        local_218.field_2._8_8_ = plVar2[3];
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      }
      else {
        local_218.field_2._M_allocated_capacity = *psVar6;
        local_218._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_218._M_string_length = plVar2[1];
      *plVar2 = (long)psVar6;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      indent_00 = (uint32_t)psVar6;
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if (local_1f8 != local_1e8) {
        operator_delete(local_1f8,local_1e8[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
    }
    bVar1 = AttrMetas::authored(&attr->_metas);
    if (bVar1) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," (\n",3);
      print_attr_metas_abi_cxx11_
                (&local_238,(tinyusdz *)attr,(AttrMeta *)(ulong)(indent + 1),indent_00);
      poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_238._M_dataplus._M_p,local_238._M_string_length);
      pprint::Indent_abi_cxx11_(&local_218,(pprint *)(ulong)indent,n_00);
      poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_218._M_dataplus._M_p,local_218._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    if ((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pprint::Indent_abi_cxx11_(&local_238,this,n_01);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_238._M_dataplus._M_p,local_238._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"token ",6);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,(name->_M_dataplus)._M_p,name->_M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".connect = ",0xb);
      v = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
          .super__Vector_impl_data._M_start;
      lVar4 = ((long)(attr->_paths).
                     super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)v >> 4) * 0x4ec4ec4ec4ec4ec5;
      if (lVar4 == 0) {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[InternalError]",0xf);
      }
      else if (lVar4 == 1) {
        ::std::operator<<(local_1a8,v);
      }
      else {
        ::std::operator<<(local_1a8,&attr->_paths);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    }
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_token_attr(const TypedAttributeWithFallback<T> &attr,
                                   const std::string &name,
                                   const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    ss << pprint::Indent(indent);

    ss << "uniform token " << name;

    if (attr.is_blocked()) {
      ss << " = None";
    } else {
      ss << " = " << quote(to_string(attr.get_value()));
    }

    if (attr.metas().authored()) {
      ss << " (\n"
         << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
         << ")";
    }
    ss << "\n";

    if (attr.has_connections()) {
      ss << pprint::Indent(indent);

      ss << "token " << name;

      ss << ".connect = ";
      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }
      ss << "\n";
    }
  }

  return ss.str();
}